

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

void __thiscall
adios2::query::QueryComposite::BlockIndexEvaluate
          (QueryComposite *this,IO *io,Engine *reader,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *touchedBlocks)

{
  Relation RVar1;
  pointer pBVar2;
  pointer pBVar3;
  long lVar4;
  bool bVar5;
  pointer cpy;
  BlockHit *cpy_00;
  byte bVar6;
  long lVar7;
  pointer cpy_01;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> currBlocks;
  BlockHit b;
  int local_c4;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> local_b8;
  QueryComposite *local_98;
  IO *local_90;
  Engine *local_88;
  pointer local_80;
  pointer local_78;
  BlockHit local_70;
  BlockHit local_50;
  
  local_78 = (this->m_Nodes).
             super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->m_Nodes).
             super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_80 != local_78) {
    local_c4 = 0;
    local_98 = this;
    local_90 = io;
    local_88 = reader;
    for (; local_78 != local_80; local_78 = local_78 + 1) {
      local_b8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_start = (BlockHit *)0x0;
      local_b8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_finish = (BlockHit *)0x0;
      local_b8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*(*local_78)->_vptr_QueryBase[4])(*local_78,local_90,local_88,&local_b8);
      pBVar3 = local_b8.
               super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_c4 == 0) {
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::operator=
                  (touchedBlocks,&local_b8);
      }
      else {
        RVar1 = local_98->m_Relation;
        if (local_b8.
            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_b8.
            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          if (RVar1 == AND) {
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::clear
                      (touchedBlocks);
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
                      (&local_b8);
            return;
          }
        }
        else if (RVar1 == AND) {
          lVar4 = (long)(touchedBlocks->
                        super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(touchedBlocks->
                        super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_005e8f03:
          lVar7 = lVar4;
          pBVar3 = local_b8.
                   super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          cpy_00 = local_b8.
                   super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (lVar7 != 0) {
            do {
              lVar4 = lVar7 + -1;
              if (cpy_00 == pBVar3) {
                std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
                erase(touchedBlocks,
                      (touchedBlocks->
                      super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar7 + -1);
                break;
              }
              BlockHit::BlockHit(&local_70,cpy_00);
              bVar5 = BlockHit::applyIntersection
                                ((touchedBlocks->
                                 super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar7,&local_70);
              std::
              vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::~vector(&local_70.m_Regions);
              cpy_00 = cpy_00 + 1;
            } while (!bVar5);
            goto LAB_005e8f03;
          }
        }
        else {
          cpy = local_b8.
                super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                ._M_impl.super__Vector_impl_data._M_start;
          if (RVar1 == OR) {
            for (; cpy != pBVar3; cpy = cpy + 1) {
              BlockHit::BlockHit(&local_70,cpy);
              pBVar2 = (touchedBlocks->
                       super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              bVar6 = 0;
              for (cpy_01 = (touchedBlocks->
                            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                            )._M_impl.super__Vector_impl_data._M_start; cpy_01 != pBVar2;
                  cpy_01 = cpy_01 + 1) {
                BlockHit::BlockHit(&local_50,cpy_01);
                bVar5 = BlockHit::applyExtension(&local_50,&local_70);
                bVar6 = bVar6 | bVar5;
                std::
                vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::~vector(&local_50.m_Regions);
              }
              if (bVar6 == 0) {
                std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
                push_back(touchedBlocks,&local_70);
              }
              std::
              vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::~vector(&local_70.m_Regions);
            }
          }
        }
      }
      local_c4 = local_c4 + 1;
      std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
                (&local_b8);
    }
  }
  return;
}

Assistant:

void QueryComposite::BlockIndexEvaluate(adios2::core::IO &io, adios2::core::Engine &reader,
                                        // std::vector<Box<Dims>> &touchedBlocks)
                                        std::vector<BlockHit> &touchedBlocks)
{
    auto lf_ApplyAND = [&](std::vector<BlockHit> &touched,
                           const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
        {
            touched.clear();
            return;
        }

        for (auto i = touched.size(); i >= 1; i--)
        {
            bool intersects = false;
            for (auto b : curr)
            {
                if (touched[i].applyIntersection(b))
                {
                    intersects = true;
                    break;
                }
            }
            if (!intersects)
                touched.erase(touched.begin() + i - 1);
        }
    }; // lf_ApplyAND

    auto lf_ApplyOR = [&](std::vector<BlockHit> &touched,
                          const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
            return;

        for (auto b : curr)
        {
            bool duplicated = false;
            for (auto box : touched)
            {
                if (box.applyExtension(b))
                {
                    duplicated = true;
                    continue;
                }
            }
            if (!duplicated)
                touched.push_back(b);
        }
    }; // lf_ApplyOR

    if (m_Nodes.size() == 0)
        return;

    int counter = 0;
    for (auto node : m_Nodes)
    {
        counter++;
        std::vector<BlockHit> currBlocks;
        node->BlockIndexEvaluate(io, reader, currBlocks);
        if (counter == 1)
        {
            touchedBlocks = currBlocks;
            continue;
        }

        if (currBlocks.size() == 0)
        {
            if (adios2::query::Relation::AND == m_Relation)
            {
                touchedBlocks.clear();
                break;
            }
            else
                continue;
        }

        if (adios2::query::Relation::AND == m_Relation)
            lf_ApplyAND(touchedBlocks, currBlocks);
        else if (adios2::query::Relation::OR == m_Relation)
            lf_ApplyOR(touchedBlocks, currBlocks);
    }
}